

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O1

int If_ManCutAigDelay_rec(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void **ppvVar4;
  uint uVar5;
  
  uVar5 = *(uint *)pObj;
  if ((uVar5 >> 9 & 1) != 0) {
    return (pObj->field_22).iCopy;
  }
  if ((uVar5 & 0xf) - 1 < 2) {
    return -1;
  }
  if ((uVar5 & 0xf) != 4) {
    __assert_fail("If_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0x3a,"int If_ManCutAigDelay_rec(If_Man_t *, If_Obj_t *, Vec_Ptr_t *)");
  }
  *(uint *)pObj = uVar5 | 0x200;
  uVar5 = vVisited->nCap;
  if (vVisited->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vVisited->pArray,0x80);
      }
      vVisited->pArray = ppvVar4;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar5 * 2;
      if (iVar3 <= (int)uVar5) goto LAB_0042db8b;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vVisited->pArray,(ulong)uVar5 << 4);
      }
      vVisited->pArray = ppvVar4;
    }
    vVisited->nCap = iVar3;
  }
LAB_0042db8b:
  iVar3 = vVisited->nSize;
  vVisited->nSize = iVar3 + 1;
  vVisited->pArray[iVar3] = pObj;
  uVar1 = If_ManCutAigDelay_rec(p,pObj->pFanin0,vVisited);
  uVar2 = If_ManCutAigDelay_rec(p,pObj->pFanin1,vVisited);
  uVar5 = uVar2;
  if ((int)uVar2 < (int)uVar1) {
    uVar5 = uVar1;
  }
  iVar3 = -1;
  if (-1 < (int)(uVar2 | uVar1)) {
    iVar3 = uVar5 + 1;
  }
  (pObj->field_22).iCopy = iVar3;
  return iVar3;
}

Assistant:

int If_ManCutAigDelay_rec( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vVisited )
{
    int Delay0, Delay1;
    if ( pObj->fVisit )
        return pObj->iCopy;
    if ( If_ObjIsCi(pObj) || If_ObjIsConst1(pObj) )
        return -1;
    // store the node in the structure by level
    assert( If_ObjIsAnd(pObj) );
    pObj->fVisit = 1;
    Vec_PtrPush( vVisited, pObj );
    Delay0 = If_ManCutAigDelay_rec( p, pObj->pFanin0, vVisited );
    Delay1 = If_ManCutAigDelay_rec( p, pObj->pFanin1, vVisited );
    pObj->iCopy = (Delay0 >= 0 && Delay1 >= 0) ? 1 + Abc_MaxInt(Delay0, Delay1) : -1;
    return pObj->iCopy;
}